

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::device_tree::parse_file
          (device_tree *this,text_input_buffer *input,
          vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
          *roots,bool *read_header)

{
  bool bVar1;
  __type _Var2;
  unsigned_long_long start;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  node_ptr n;
  unsigned_long_long len;
  device_tree *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  define_map *local_90;
  string ref;
  __node_base_ptr p_Stack_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>> *local_48;
  
  local_48 = (vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)roots;
  while( true ) {
    text_input_buffer::next_token(input);
    bVar1 = text_input_buffer::consume(input,"/dts-v1/;");
    if (!bVar1) break;
    *read_header = true;
  }
  bVar1 = text_input_buffer::consume(input,"/plugin/;");
  if (bVar1) {
    this->is_plugin = true;
  }
  text_input_buffer::next_token(input);
  if (*read_header == false) {
    text_input_buffer::parse_error(input,"Expected /dts-v1/; version string");
  }
  do {
    bVar1 = text_input_buffer::consume(input,"/memreserve/");
    if (!bVar1) {
      local_90 = &this->defines;
      local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->deletions;
      while ((this->valid == true && (bVar1 = text_input_buffer::finished(input), !bVar1))) {
        n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar1 = text_input_buffer::consume(input,"/delete-node/");
        if (bVar1) {
          text_input_buffer::next_token(input);
          len = (unsigned_long_long)input;
          local_a8 = this;
          bVar1 = parse_file(dtc::text_input_buffer&,std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>&,bool&)
                  ::$_0::operator()((string *)&len,'&',
                                    "Expected reference after top-level /delete-node/.");
          if (bVar1) {
            text_input_buffer::parse_node_name_abi_cxx11_(&ref,input);
            start = (unsigned_long_long)&local_d8;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ref,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&start);
            std::__cxx11::string::~string((string *)&start);
            if (_Var2) {
              text_input_buffer::parse_error
                        (input,"Expected label name for top-level /delete-node/.");
              this->valid = false;
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ref);
            }
            parse_file(dtc::text_input_buffer&,std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>&,bool&)
            ::$_0::operator()((string *)&len,';',"Missing semicolon.");
            std::__cxx11::string::~string((string *)&ref);
          }
        }
        else {
          bVar1 = text_input_buffer::consume(input,'/');
          if (bVar1) {
            text_input_buffer::next_token(input);
            start = (unsigned_long_long)&local_d8;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            ref._M_dataplus._M_p = (pointer)&p_Stack_58;
            ref._M_string_length = 1;
            ref.field_2._M_allocated_capacity = 0;
            ref.field_2._8_8_ = 0;
            p_Stack_58 = (__node_base_ptr)0x0;
            len = (unsigned_long_long)&local_a0;
            local_a8 = (device_tree *)0x0;
            local_a0._M_local_buf[0] = '\0';
            node::parse((node *)&stack0xffffffffffffffc0,input,this,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                        (string_set *)&ref,(string *)&len,local_90);
            std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *)
                       &stack0xffffffffffffffc0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
            std::__cxx11::string::~string((string *)&len);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&ref);
            std::__cxx11::string::~string((string *)&start);
          }
          else {
            bVar1 = text_input_buffer::consume(input,'&');
            if (bVar1) {
              text_input_buffer::next_token(input);
              start = (unsigned_long_long)&local_d8;
              local_e0 = 0;
              local_d8._M_local_buf[0] = '\0';
              bVar1 = text_input_buffer::consume(input,'{');
              if ((bVar1) && (this->is_plugin == true)) {
                text_input_buffer::parse_to_abi_cxx11_(&ref,input,'}');
                std::__cxx11::string::operator=((string *)&start,(string *)&ref);
                std::__cxx11::string::~string((string *)&ref);
                bVar1 = true;
                text_input_buffer::consume(input,'}');
              }
              else {
                text_input_buffer::parse_node_name_abi_cxx11_(&ref,input);
                std::__cxx11::string::operator=((string *)&start,(string *)&ref);
                std::__cxx11::string::~string((string *)&ref);
                bVar1 = false;
              }
              text_input_buffer::next_token(input);
              ref._M_dataplus._M_p = (pointer)&p_Stack_58;
              ref._M_string_length = 1;
              ref.field_2._M_allocated_capacity = 0;
              ref.field_2._8_8_ = 0;
              p_Stack_58 = (__node_base_ptr)0x0;
              len = (unsigned_long_long)&local_a0;
              local_a8 = (device_tree *)0x0;
              local_a0._M_local_buf[0] = '\0';
              node::parse((node *)&stack0xffffffffffffffc0,input,this,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &start,(string_set *)&ref,(string *)&len,local_90);
              std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *)
                         &stack0xffffffffffffffc0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
              std::__cxx11::string::~string((string *)&len);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)&ref);
              if (n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                (n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                name_is_path_reference = bVar1;
              }
              std::__cxx11::string::~string((string *)&start);
            }
            else {
              text_input_buffer::parse_error(input,"Failed to find root node /.");
            }
          }
          if (n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            this->valid = false;
          }
          else {
            std::
            vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
            ::emplace_back<std::shared_ptr<dtc::fdt::node>>(local_48,&n);
          }
          text_input_buffer::next_token(input);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&n.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      return;
    }
    text_input_buffer::next_token(input);
    bVar1 = text_input_buffer::consume_integer_expression(input,&start);
    if (bVar1) {
      text_input_buffer::next_token(input);
      bVar1 = text_input_buffer::consume_integer_expression(input,&len);
      if (!bVar1) goto LAB_001300aa;
      ref._M_dataplus._M_p = (pointer)start;
      ref._M_string_length = len;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->reservations,(pair<unsigned_long,_unsigned_long> *)&ref);
    }
    else {
LAB_001300aa:
      text_input_buffer::parse_error(input,"Expected size on /memreserve/ node.");
    }
    text_input_buffer::next_token(input);
    text_input_buffer::consume(input,';');
    text_input_buffer::next_token(input);
  } while( true );
}

Assistant:

void
device_tree::parse_file(text_input_buffer &input,
                        std::vector<node_ptr> &roots,
                        bool &read_header)
{
	input.next_token();
	// Read the header
	while (input.consume("/dts-v1/;"))
	{
		read_header = true;
		input.next_token();
	}
	if (input.consume("/plugin/;"))
	{
		is_plugin = true;
	}
	input.next_token();
	if (!read_header)
	{
		input.parse_error("Expected /dts-v1/; version string");
	}
	// Read any memory reservations
	while (input.consume("/memreserve/"))
	{
		unsigned long long start, len;
		input.next_token();
		// Read the start and length.
		if (!(input.consume_integer_expression(start) &&
		    (input.next_token(),
		    input.consume_integer_expression(len))))
		{
			input.parse_error("Expected size on /memreserve/ node.");
		}
		else
		{
			reservations.push_back(reservation(start, len));
		}
		input.next_token();
		input.consume(';');
		input.next_token();
	}
	while (valid && !input.finished())
	{
		node_ptr n;
		if (input.consume("/delete-node/"))
		{
			// Top-level /delete-node/ directives refer to references that must
			// be deleted later.
			input.next_token();
			auto expect = [&](auto token, const char *msg)
			{
				if (!input.consume(token))
				{
					input.parse_error(msg);
					valid = false;
				}
				input.next_token();
				return valid;
			};
			if (expect('&', "Expected reference after top-level /delete-node/."))
			{
				string ref = input.parse_node_name();
				if (ref == string())
				{
					input.parse_error("Expected label name for top-level /delete-node/.");
					valid = false;
				}
				else
				{
					deletions.push_back(std::move(ref));
				}
				expect(';', "Missing semicolon.");
			}
			continue;
		}
		else if (input.consume('/'))
		{
			input.next_token();
			n = node::parse(input, *this, string(), string_set(), string(), &defines);
		}
		else if (input.consume('&'))
		{
			input.next_token();
			string name;
			bool name_is_path_reference = false;
			// This is to deal with names intended as path references, e.g. &{/path}.
			// While it may make sense in a non-plugin context, we don't support such
			// usage at this time.
			if (input.consume('{') && is_plugin)
			{
				name = input.parse_to('}');
				input.consume('}');
				name_is_path_reference = true;
			}
			else
			{
				name = input.parse_node_name();
			}
			input.next_token();
			n = node::parse(input, *this, std::move(name), string_set(), string(), &defines);
			if (n)
			{
				n->name_is_path_reference = name_is_path_reference;
			}
		}
		else
		{
			input.parse_error("Failed to find root node /.");
		}
		if (n)
		{
			roots.push_back(std::move(n));
		}
		else
		{
			valid = false;
		}
		input.next_token();
	}
}